

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertTest.cpp
# Opt level: O2

int main(void)

{
  Node *pNVar1;
  LinkedList *this;
  Node *pNVar2;
  int iVar3;
  Node *head;
  
  head = (Node *)0x0;
  this = (LinkedList *)operator_new(1);
  for (iVar3 = 1; iVar3 != 0x65; iVar3 = iVar3 + 1) {
    LinkedList::prepend(this,&head,iVar3);
  }
  LinkedList::insert(this,&head,200,1);
  LinkedList::insert(this,&head,200,100);
  pNVar1 = head;
  do {
    pNVar2 = pNVar1;
    pNVar1 = pNVar2->next;
  } while (pNVar1 != (Node *)0x0);
  if ((head->next->data != 200) || (iVar3 = 0, pNVar2->data != 200)) {
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main() {
	Node* head = nullptr;
	LinkedList* test = new LinkedList();

	for (int i = 0; i < 100; i++) {
		test->prepend(&head, i + 1);
	}

	test->insert(&head, 200, 1);
	test->insert(&head, 200, 100);

    Node* loopInstance = head;
    while (loopInstance->next != nullptr) {
		loopInstance = loopInstance->next;
	}

    if (head->next->data == 200 && loopInstance->data == 200) {
		return 0;
	} else {
		return 1;
	}
}